

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw.cpp
# Opt level: O2

void tmvline4_subclamp(void)

{
  DWORD *pDVar1;
  DWORD *pDVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  byte *pbVar10;
  byte *pbVar11;
  
  iVar3 = tmvlinebits;
  pDVar2 = dc_destblend;
  pDVar1 = dc_srcblend;
  pbVar11 = dc_dest;
  iVar5 = dc_count;
  do {
    lVar8 = 0;
    pbVar10 = pbVar11;
    for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 8) {
      uVar4 = *(uint *)((long)vplce + lVar8);
      uVar7 = (ulong)*(byte *)(*(long *)((long)bufplce + lVar9) +
                              (ulong)(uVar4 >> ((byte)iVar3 & 0x3f)));
      if (uVar7 != 0) {
        uVar4 = (pDVar1[*(byte *)(*(long *)((long)palookupoffse + lVar9) + uVar7)] | 0x40100400) -
                pDVar2[*pbVar10];
        uVar6 = uVar4 & 0x40100400;
        uVar4 = uVar6 - (uVar6 >> 5) & uVar4 | 0x1f07c1f;
        *pbVar10 = RGB32k.All[uVar4 >> 0xf & uVar4];
        uVar4 = *(uint *)((long)vplce + lVar8);
      }
      *(uint *)((long)vplce + lVar8) = uVar4 + *(int *)((long)vince + lVar8);
      lVar8 = lVar8 + 4;
      pbVar10 = pbVar10 + 1;
    }
    pbVar11 = pbVar11 + dc_pitch;
    iVar5 = iVar5 + -1;
  } while (iVar5 != 0);
  return;
}

Assistant:

void tmvline4_subclamp ()
{
	BYTE *dest = dc_dest;
	int count = dc_count;
	int bits = tmvlinebits;

	DWORD *fg2rgb = dc_srcblend;
	DWORD *bg2rgb = dc_destblend;

	do
	{
		for (int i = 0; i < 4; ++i)
		{
			BYTE pix = bufplce[i][vplce[i] >> bits];
			if (pix != 0)
			{
				DWORD a = (fg2rgb[palookupoffse[i][pix]] | 0x40100400) - bg2rgb[dest[i]];
				DWORD b = a;

				b &= 0x40100400;
				b = b - (b >> 5);
				a &= b;
				a |= 0x01f07c1f;
				dest[i] = RGB32k.All[a & (a>>15)];
			}
			vplce[i] += vince[i];
		}
		dest += dc_pitch;
	} while (--count);
}